

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::ChMatterSPH(ChMatterSPH *this,ChMatterSPH *other)

{
  double dVar1;
  int newsize;
  
  ChIndexedNodes::ChIndexedNodes(&this->super_ChIndexedNodes,&other->super_ChIndexedNodes);
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChMatterSPH_0115b470;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->material).super_ChContinuumMaterial._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumMaterial_0115b440;
  (this->material).super_ChContinuumMaterial.density = 1000.0;
  (this->material).viscosity = 0.1;
  (this->material).surface_tension = 0.0;
  (this->material).pressure_stiffness = 100.0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->do_collide = other->do_collide;
  (this->material).super_ChContinuumMaterial.density =
       (other->material).super_ChContinuumMaterial.density;
  dVar1 = (other->material).surface_tension;
  (this->material).viscosity = (other->material).viscosity;
  (this->material).surface_tension = dVar1;
  (this->material).pressure_stiffness = (other->material).pressure_stiffness;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &(other->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  newsize = (*(other->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                      (other);
  ResizeNnodes(this,newsize);
  return;
}

Assistant:

ChMatterSPH::ChMatterSPH(const ChMatterSPH& other) : ChIndexedNodes(other) {
    do_collide = other.do_collide;

    material = other.material;
    matsurface = other.matsurface;

    ResizeNnodes(other.GetNnodes());
}